

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::remaxRow(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int p_row,int len)

{
  type_conflict5 tVar1;
  int *a;
  long lVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  Dring *ring;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *val;
  int *idx;
  int k;
  int j;
  int i;
  int delta;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  undefined4 in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd40;
  int *in_stack_fffffffffffffd48;
  undefined1 local_2a8 [40];
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd80;
  undefined1 local_258 [80];
  long *local_208;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_200;
  long local_1f8;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e4;
  undefined1 local_194 [80];
  int local_144;
  int local_140;
  int local_13c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  long local_120;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_111;
  int *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  int *local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  undefined1 *local_e0;
  long local_d8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_c9;
  int *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  int *local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  long local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  int *local_80;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  int *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  undefined1 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  int *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_140 = in_EDX;
  local_13c = in_ESI;
  if (*(long *)(*(long *)(in_RDI + 0x278) + (long)in_ESI * 0x18) == in_RDI + 0x260) {
    local_144 = in_EDX - *(int *)(*(long *)(in_RDI + 0x2b8) + (long)in_ESI * 4);
    if (*(int *)(in_RDI + 0x280) - *(int *)(in_RDI + 0x284) < local_144) {
      packRows(in_stack_fffffffffffffd80);
      local_144 = local_140 - *(int *)(*(long *)(in_RDI + 0x2b8) + (long)local_13c * 4);
      a = (int *)(in_RDI + 0x280);
      local_c0 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(in_RDI + 0xac);
      local_c8 = (int *)(in_RDI + 0x284);
      local_b8 = &local_1e4;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_c9,local_c0);
      local_b0 = &local_1e4;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffd40);
      local_98 = &local_1e4;
      local_a0 = local_c0;
      local_a8 = local_c8;
      local_d8 = (long)*local_c8;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffd40,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),(longlong *)0x53bc1b)
      ;
      local_28 = local_194;
      local_30 = &local_1e4;
      local_38 = &local_140;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_39,local_30);
      local_20 = local_194;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffd40);
      local_8 = local_194;
      local_10 = local_30;
      local_18 = local_38;
      local_48 = (long)*local_38;
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffd40,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),(longlong *)0x53bcdd)
      ;
      tVar1 = boost::multiprecision::operator<
                        (a,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffffd40);
      if (tVar1) {
        minRowMem(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
      }
    }
    *(int *)(in_RDI + 0x284) = local_144 + *(int *)(in_RDI + 0x284);
    *(int *)(*(long *)(in_RDI + 0x2b8) + (long)local_13c * 4) = local_140;
  }
  else {
    if (*(int *)(in_RDI + 0x280) - *(int *)(in_RDI + 0x284) < in_EDX) {
      packRows(in_stack_fffffffffffffd80);
      in_stack_fffffffffffffd40 =
           (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)(in_RDI + 0x280);
      local_108 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)(in_RDI + 0xac);
      local_110 = (int *)(in_RDI + 0x284);
      local_100 = local_2a8;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_111,local_108);
      local_f8 = local_2a8;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffd40);
      local_e0 = local_2a8;
      local_e8 = local_108;
      local_f0 = local_110;
      local_120 = (long)*local_110;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffd40,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),(longlong *)0x53be45)
      ;
      local_70 = local_258;
      local_78 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_2a8;
      local_80 = &local_140;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_81,local_78);
      local_68 = local_258;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffd40);
      local_50 = local_258;
      local_58 = local_78;
      local_60 = local_80;
      local_90 = (long)*local_80;
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,long_long>
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffd40,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),(longlong *)0x53befb)
      ;
      tVar1 = boost::multiprecision::operator<
                        (in_stack_fffffffffffffd48,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffffd40);
      if (tVar1) {
        minRowMem(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
      }
    }
    local_1ec = *(int *)(in_RDI + 0x284);
    local_1e8 = *(int *)(*(long *)(in_RDI + 0x2a8) + (long)local_13c * 4);
    local_1f0 = *(int *)(*(long *)(in_RDI + 0x2b0) + (long)local_13c * 4) + local_1e8;
    *(int *)(*(long *)(in_RDI + 0x2a8) + (long)local_13c * 4) = local_1ec;
    *(int *)(in_RDI + 0x284) = local_140 + *(int *)(in_RDI + 0x284);
    lVar2 = (long)*(int *)(*(long *)(*(long *)(in_RDI + 0x278) + (long)local_13c * 0x18 + 8) + 0x10)
    ;
    *(int *)(*(long *)(in_RDI + 0x2b8) + lVar2 * 4) =
         *(int *)(*(long *)(in_RDI + 0x2b8) + (long)local_13c * 4) +
         *(int *)(*(long *)(in_RDI + 0x2b8) + lVar2 * 4);
    *(int *)(*(long *)(in_RDI + 0x2b8) + (long)local_13c * 4) = local_140;
    *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x278) + (long)local_13c * 0x18) + 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x278) + (long)local_13c * 0x18 + 8);
    **(undefined8 **)(*(long *)(in_RDI + 0x278) + (long)local_13c * 0x18 + 8) =
         *(undefined8 *)(*(long *)(in_RDI + 0x278) + (long)local_13c * 0x18);
    local_208 = *(long **)(in_RDI + 0x268);
    *(long *)(*(long *)(in_RDI + 0x278) + (long)local_13c * 0x18) = *local_208;
    *(long *)(*(long *)(*(long *)(in_RDI + 0x278) + (long)local_13c * 0x18) + 8) =
         *(long *)(in_RDI + 0x278) + (long)local_13c * 0x18;
    *(long **)(*(long *)(in_RDI + 0x278) + (long)local_13c * 0x18 + 8) = local_208;
    *local_208 = *(long *)(in_RDI + 0x278) + (long)local_13c * 0x18;
    local_1f8 = *(long *)(in_RDI + 0x2a0);
    local_200 = std::
                vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ::data((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        *)0x53c12d);
    for (; local_1e8 < local_1f0; local_1e8 = local_1e8 + 1) {
      local_130 = local_200 + local_1e8;
      local_128 = local_200 + local_1ec;
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffffd40,
                 (cpp_dec_float<100U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      *(undefined4 *)(local_1f8 + (long)local_1ec * 4) =
           *(undefined4 *)(local_1f8 + (long)local_1e8 * 4);
      local_1ec = local_1ec + 1;
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::remaxRow(int p_row, int len)
{
   assert(u.row.max[p_row] < len);

   if(u.row.elem[p_row].next == &(u.row.list))      /* last in row file */
   {
      int delta = len - u.row.max[p_row];

      if(delta > u.row.size - u.row.used)
      {
         packRows();
         delta = len - u.row.max[p_row];  // packRows() changes u.row.max[] !

         if(u.row.size < rowMemMult * u.row.used + len)
            minRowMem(2 * u.row.used + len);

         /* minRowMem(rowMemMult * u.row.used + len); */
      }

      assert(delta <= u.row.size - u.row.used

             && "ERROR: could not allocate memory for row file");

      u.row.used += delta;
      u.row.max[p_row] = len;
   }
   else                        /* row must be moved to end of row file */
   {
      int i, j, k;
      int* idx;
      R* val;
      Dring* ring;

      if(len > u.row.size - u.row.used)
      {
         packRows();

         if(u.row.size < rowMemMult * u.row.used + len)
            minRowMem(2 * u.row.used + len);

         /* minRowMem(rowMemMult * u.row.used + len);*/
      }

      assert(len <= u.row.size - u.row.used

             && "ERROR: could not allocate memory for row file");

      j = u.row.used;
      i = u.row.start[p_row];
      k = u.row.len[p_row] + i;
      u.row.start[p_row] = j;
      u.row.used += len;

      u.row.max[u.row.elem[p_row].prev->idx] += u.row.max[p_row];
      u.row.max[p_row] = len;
      removeDR(u.row.elem[p_row]);
      ring = u.row.list.prev;
      init2DR(u.row.elem[p_row], *ring);

      idx = u.row.idx;
      val = u.row.val.data();

      for(; i < k; ++i, ++j)
      {
         val[j] = val[i];
         idx[j] = idx[i];
      }
   }

   assert(u.row.start[u.row.list.prev->idx] + u.row.max[u.row.list.prev->idx]

          == u.row.used);
}